

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_result_blob64(sqlite3_context *pCtx,void *z,sqlite3_uint64 n,_func_void_void_ptr *xDel)

{
  if (n >> 0x1f != 0) {
    invokeValueDestructor(z,xDel,pCtx);
    return;
  }
  setResultStrOrError(pCtx,(char *)z,(int)n,'\0',xDel);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_blob64(
  sqlite3_context *pCtx,
  const void *z,
  sqlite3_uint64 n,
  void (*xDel)(void *)
){
  assert( xDel!=SQLITE_DYNAMIC );
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ){
    invokeValueDestructor(z, xDel, 0);
    return;
  }
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  if( n>0x7fffffff ){
    (void)invokeValueDestructor(z, xDel, pCtx);
  }else{
    setResultStrOrError(pCtx, z, (int)n, 0, xDel);
  }
}